

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O0

void inner_product_suite::test_overfull(void)

{
  initializer_list<int> input;
  initializer_list<int> input_00;
  iterator pvVar1;
  iterator end;
  undefined4 local_dc;
  basic_iterator<int> local_d8;
  iterator local_c8;
  int local_b4 [2];
  int local_ac [5];
  iterator local_98;
  undefined8 local_90;
  undefined4 local_84;
  basic_iterator<int> local_80;
  iterator local_70;
  int local_60 [2];
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  memset(&span.member.next,0,0x10);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.next);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,pvVar1,end);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input_00._M_len = 4;
  input_00._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_00);
  local_70 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_80 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  local_60[0] = std::
                inner_product<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*,int>
                          (local_70,local_80,pvVar1,0);
  local_84 = 0xe2e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "11 * 11 + 22 * 22 + 33 * 33 + 44 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x34,"void inner_product_suite::test_overfull()",local_60,&local_84);
  local_ac[0] = 0xb;
  local_ac[1] = 0x16;
  local_ac[2] = 0x21;
  local_ac[3] = 0x2c;
  local_ac[4] = 0x37;
  local_98 = local_ac;
  local_90 = 5;
  input._M_len = 5;
  input._M_array = local_98;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_d8 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  local_b4[0] = std::
                inner_product<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*,int>
                          (local_c8,local_d8,pvVar1,0);
  local_dc = 0x16b0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "22 * 55 + 33 * 22 + 44 * 33 + 55 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x37,"void inner_product_suite::test_overfull()",local_b4,&local_dc);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  11 * 11 + 22 * 22 + 33 * 33 + 44 * 44);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  22 * 55 + 33 * 22 + 44 * 33 + 55 * 44);
}